

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

CompilerReflection * __thiscall
spirv_cross::CompilerReflection::compile_abi_cxx11_(CompilerReflection *this)

{
  element_type *peVar1;
  CompilerReflection *in_RSI;
  shared_ptr<simple_json::Stream> local_28;
  CompilerReflection *this_local;
  
  this_local = this;
  ::std::make_shared<simple_json::Stream>();
  ::std::shared_ptr<simple_json::Stream>::operator=(&in_RSI->json_stream,&local_28);
  ::std::shared_ptr<simple_json::Stream>::~shared_ptr(&local_28);
  peVar1 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&in_RSI->json_stream);
  simple_json::Stream::set_current_locale_radix_character
            (peVar1,(in_RSI->super_CompilerGLSL).current_locale_radix_character);
  peVar1 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&in_RSI->json_stream);
  simple_json::Stream::begin_json_object(peVar1);
  CompilerGLSL::reorder_type_alias(&in_RSI->super_CompilerGLSL);
  emit_entry_points(in_RSI);
  emit_types(in_RSI);
  emit_resources(in_RSI);
  emit_specialization_constants(in_RSI);
  peVar1 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&in_RSI->json_stream);
  simple_json::Stream::end_json_object(peVar1);
  ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &in_RSI->json_stream);
  simple_json::Stream::str_abi_cxx11_((Stream *)this);
  return this;
}

Assistant:

string CompilerReflection::compile()
{
	json_stream = std::make_shared<simple_json::Stream>();
	json_stream->set_current_locale_radix_character(current_locale_radix_character);
	json_stream->begin_json_object();
	reorder_type_alias();
	emit_entry_points();
	emit_types();
	emit_resources();
	emit_specialization_constants();
	json_stream->end_json_object();
	return json_stream->str();
}